

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O0

void __thiscall tfs::TMatrix<double>::~TMatrix(TMatrix<double> *this)

{
  long in_RDI;
  
  if (*(void **)(in_RDI + 0x40) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x40));
  }
  *(undefined8 *)(in_RDI + 0x40) = 0;
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  *(undefined8 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

~TMatrix( void ) {      // Destructor
            delete[] m_data;
            m_data   = 0;
            m_end    = 0;
            m_count  = 0;
            m_length = 0;
        }